

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O2

bool anon_unknown.dwarf_1d7349::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int lx,int rx,int ly,int ry,int width)

{
  float *pfVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  half local_5a;
  long local_58;
  int local_50;
  float local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  local_40 = (long)lx;
  local_38 = (long)rx;
  lVar5 = (long)ly;
  local_58 = lVar5 * 2;
  iVar4 = ly * width;
  local_50 = width;
  do {
    lVar6 = local_40;
    local_48 = lVar5;
    if (ry < lVar5) {
LAB_001747e7:
      return ry < lVar5;
    }
    for (; lVar6 <= local_38; lVar6 = lVar6 + 1) {
      local_4c = *(float *)(_imath_half_to_float_table +
                           (ulong)*(uint16_t *)((long)&ph->_data[lVar6]._h + ph->_sizeY * local_58)
                           * 4);
      iVar3 = ((int)lVar6 + iVar4) % 0x801;
      Imath_3_2::half::half(&local_5a,(float)iVar3);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_5a._h * 4);
      if ((local_4c != *pfVar1) || (NAN(local_4c) || NAN(*pfVar1))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar6);
        poVar2 = std::operator<<(poVar2,", ");
        lVar5 = local_48;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_48);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = (ostream *)
                 ::operator<<(poVar2,(half)*(uint16_t *)
                                            ((long)&ph->_data[lVar6]._h + local_58 * ph->_sizeY));
        poVar2 = std::operator<<(poVar2,", should be ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ostream::flush();
        goto LAB_001747e7;
      }
    }
    lVar5 = local_48 + 1;
    local_58 = local_58 + 2;
    iVar4 = iVar4 + local_50;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}